

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::loops_do(Forth *this)

{
  ForthStack<unsigned_int>::push(&this->controlStackLoops,this->dataPointer);
  data(this,5);
  data(this,this->CellSize * 3);
  data(this,5);
  data(this,this->CellSize);
  data(this,7);
  data(this,7);
  return;
}

Assistant:

void loops_do() {
			controlStackLoops.push( getDataPointer() );
			data(branchXt);
			data(CellSize*3);
			data(branchXt);
			data(CellSize);
			data(toR_Xt);
			data(toR_Xt);
		}